

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O0

value_ptr __thiscall
pstore::dump::details::default_make_value<unsigned_short_const&>(details *this,unsigned_short *t)

{
  value_ptr vVar1;
  unsigned_short *t_local;
  
  vVar1 = dump::make_value((dump *)this,t);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline value_ptr default_make_value (T const & t) {
                return make_value (t);
            }